

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void wallwalk_right(level *lev,xchar x,xchar y,schar fgtyp,schar fglit,schar bgtyp,int chance)

{
  undefined1 *puVar1;
  char cVar2;
  boolean bVar3;
  uint uVar4;
  trap *ptVar5;
  byte y_00;
  byte bVar6;
  byte bVar7;
  byte x_00;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  if (((byte)y < 0x15 && (byte)(x - 1U) < 0x4f) && (lev->locations[(byte)x][(byte)y].typ == bgtyp))
  {
    uVar9 = 1;
    x_00 = x;
    y_00 = y;
    do {
      ptVar5 = t_at(lev,(int)(char)x_00,(int)(char)y_00);
      if ((ptVar5 == (trap *)0x0) && (bVar3 = bydoor(lev,x_00,y_00), bVar3 == '\0')) {
        if ((lev->locations[(char)x_00][(char)y_00].typ == bgtyp) &&
           (uVar4 = mt_random(), (int)(uVar4 % 100) <= chance)) {
          if ((fgtyp < '\'') &&
             (lev->locations[(char)x_00][(char)y_00].typ = fgtyp, fgtyp == '\x15')) {
            puVar1 = &lev->locations[(char)x_00][(char)y_00].field_0x7;
            *puVar1 = *puVar1 | 4;
          }
          else if (fglit != -2) {
            if (fglit == -1) {
              uVar4 = mt_random();
              *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 =
                   *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 & 0xfffffbff |
                   (uVar4 & 1) << 10;
            }
            else {
              *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 =
                   *(uint *)&lev->locations[(char)x_00][(char)y_00].field_0x6 & 0xfffffbff |
                   (uint)(fglit & 1) << 10;
            }
          }
        }
      }
      iVar10 = 0;
      do {
        iVar8 = (int)uVar9;
        bVar7 = x_00;
        bVar6 = y_00;
        switch((long)iVar8 % 4 & 0xffffffff) {
        case 0:
          bVar6 = y_00 - 1;
          break;
        case 1:
          bVar7 = x_00 + 1;
          break;
        case 2:
          bVar6 = y_00 + 1;
          break;
        case 3:
          bVar7 = x_00 - 1;
        }
        if ((bVar6 < 0x15 && (byte)(bVar7 - 1) < 0x4f) &&
           (cVar2 = lev->locations[bVar7][bVar6].typ, cVar2 == fgtyp || cVar2 == bgtyp)) {
          uVar9 = (long)(iVar8 + 3) % 4 & 0xffffffff;
        }
        else {
          uVar9 = (ulong)(iVar8 + 1);
          iVar10 = iVar10 + 1;
          bVar7 = x_00;
          bVar6 = y_00;
        }
      } while (((x_00 == bVar7) && (bVar7 = x_00, y_00 == bVar6)) && (iVar10 < 5));
      x_00 = bVar7;
      y_00 = bVar6;
    } while (bVar6 != y || x_00 != x);
  }
  return;
}

Assistant:

void wallwalk_right(struct level *lev, xchar x, xchar y,
		    schar fgtyp, schar fglit, schar bgtyp, int chance)
{
	int sx, sy, nx, ny, dir, cnt;
	schar tmptyp;
	sx = x;
	sy = y;
	dir = 1;

	if (!isok(x,y)) return;
	if (lev->locations[x][y].typ != bgtyp) return;

	do {
	    if (!t_at(lev, x, y) && !bydoor(lev, x, y) &&
		lev->locations[x][y].typ == bgtyp && chance >= rn2(100)) {
		SET_TYPLIT(lev, x, y, fgtyp, fglit);
	    }
	    cnt = 0;
	    do {
		nx = x;
		ny = y;
		switch (dir % 4) {
		case 0: y--; break;
		case 1: x++; break;
		case 2: y++; break;
		case 3: x--; break;
		}
		if (isok(x, y)) {
		    tmptyp = lev->locations[x][y].typ;
		    if (tmptyp != bgtyp && tmptyp != fgtyp) {
			dir++;
			x = nx;
			y = ny;
			cnt++;
		    } else {
			dir = (dir + 3) % 4;
		    }
		} else {
		    dir++;
		    x = nx;
		    y = ny;
		    cnt++;
		}
	    } while (nx == x && ny == y && cnt < 5);
	} while (x != sx || y != sy);
}